

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

char * lib_copy_str(char *str,size_t len)

{
  char *__dest;
  
  if ((str != (char *)0x0) && (__dest = lib_alloc_str(len), __dest != (char *)0x0)) {
    memcpy(__dest,str,len);
    __dest[len] = '\0';
    return __dest;
  }
  return (char *)0x0;
}

Assistant:

char *lib_copy_str(const char *str, size_t len)
{
    /* if the source string is null, just return null as the result */
    if (str == 0)
        return 0;

    /* allocate space */
    char *buf = lib_alloc_str(len);

    /* if that succeeded, make a copy */
    if (buf != 0)
    {
        /* copy the string */
        memcpy(buf, str, len);

        /* null-terminate it */
        buf[len] = '\0';
    }

    /* return the buffer */
    return buf;
}